

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O0

WordType llvm::APInt::tcSubtractPart(WordType *dst,WordType src,uint parts)

{
  ulong uVar1;
  WordType Dst;
  uint i;
  uint parts_local;
  WordType src_local;
  WordType *dst_local;
  
  Dst._0_4_ = 0;
  _i = src;
  while( true ) {
    if (parts <= (uint)Dst) {
      return 1;
    }
    uVar1 = dst[(uint)Dst];
    dst[(uint)Dst] = dst[(uint)Dst] - _i;
    if (_i <= uVar1) break;
    _i = 1;
    Dst._0_4_ = (uint)Dst + 1;
  }
  return 0;
}

Assistant:

APInt::WordType APInt::tcSubtractPart(WordType *dst, WordType src,
                                      unsigned parts) {
  for (unsigned i = 0; i < parts; ++i) {
    WordType Dst = dst[i];
    dst[i] -= src;
    if (src <= Dst)
      return 0; // No need to borrow so exit early.
    src = 1; // We have to "borrow 1" from next "word"
  }

  return 1;
}